

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::ReadConfig(BaseTag *this,istream *is)

{
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  istream *piVar4;
  string local_290;
  istringstream local_270 [8];
  istringstream iss;
  int local_ec;
  int local_e8;
  int o;
  int w;
  int h;
  int local_d8;
  int local_d4;
  int x;
  int y;
  int local_8c;
  int local_88;
  int ncols;
  int nrows;
  string local_78 [8];
  string val;
  string key;
  string line;
  istream *is_local;
  BaseTag *this_local;
  
  std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  while( true ) {
    piVar2 = std::operator>>(is,(string *)(val.field_2._M_local_buf + 8));
    piVar2 = std::operator>>(piVar2,local_78);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&val.field_2 + 8),"mapSize");
    if (bVar1) {
      piVar4 = (istream *)std::istream::operator>>((istream *)is,&local_88);
      std::istream::operator>>(piVar4,&local_8c);
      despot::Floor::Floor((Floor *)&x,local_88,local_8c);
      Floor::operator=(&this->floor_,(Floor *)&x);
      Floor::~Floor((Floor *)&x);
      for (local_d4 = 0; local_d4 < local_88; local_d4 = local_d4 + 1) {
        std::operator>>(is,(string *)(key.field_2._M_local_buf + 8));
        for (local_d8 = 0; local_d8 < local_8c; local_d8 = local_d8 + 1) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&key.field_2 + 8));
          if (*pcVar3 != '#') {
            despot::Coord::Coord((Coord *)&w,local_d8,local_d4);
            despot::Floor::AddCell(&this->floor_,_w);
          }
        }
      }
      despot::Floor::ComputeDistances();
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&val.field_2 + 8),"width-height-obstacles");
      if (bVar1) {
        piVar4 = (istream *)std::istream::operator>>((istream *)is,&o);
        piVar4 = (istream *)std::istream::operator>>(piVar4,&local_e8);
        std::istream::operator>>(piVar4,&local_ec);
        RandomMap_abi_cxx11_(&local_290,this,o,local_e8,local_ec);
        std::__cxx11::istringstream::istringstream(local_270,(string *)&local_290,_S_in);
        std::__cxx11::string::~string((string *)&local_290);
        ReadConfig(this,(istream *)local_270);
        std::__cxx11::istringstream::~istringstream(local_270);
      }
    }
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  return;
}

Assistant:

void BaseTag::ReadConfig(istream& is) {
	string line, key, val;
	while (is >> key >> val) {
		if (key == "mapSize") {
			int nrows, ncols;
			is >> nrows >> ncols;
			floor_ = Floor(nrows, ncols);

			for (int y = 0; y < nrows; y++) {
				is >> line;
				for (int x = 0; x < ncols; x++) {
					if (line[x] != '#') {
						floor_.AddCell(Coord(x, y));
					}
				}
			}

			floor_.ComputeDistances();
		} else if (key == "width-height-obstacles") {
			int h, w, o;
			is >> h >> w >> o;
			istringstream iss(RandomMap(h, w, o));
			ReadConfig(iss);
		}
	}
}